

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

idx_t duckdb::TernaryExecutor::
      SelectLoop<int,_int,_int,_duckdb::BothInclusiveBetweenOperator,_false,_true,_true>
                (int *adata,int *bdata,int *cdata,SelectionVector *result_sel,idx_t count,
                SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  SelectionVector *this;
  TemplatedValidityMask<unsigned_long> *this_00;
  SelectionVector *in_RCX;
  ulong in_R8;
  SelectionVector *in_R9;
  SelectionVector *in_stack_00000008;
  bool comparison_result;
  idx_t cidx;
  idx_t bidx;
  idx_t aidx;
  idx_t result_idx;
  idx_t i;
  idx_t false_count;
  idx_t true_count;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  ushort in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff96;
  byte in_stack_ffffffffffffff97;
  undefined8 uStack_48;
  undefined8 uStack_38;
  
  uStack_38 = 0;
  for (uStack_48 = 0; uStack_48 < in_R8; uStack_48 = uStack_48 + 1) {
    SelectionVector::get_index(in_RCX,uStack_48);
    SelectionVector::get_index(in_R9,uStack_48);
    this = (SelectionVector *)SelectionVector::get_index(in_stack_00000008,uStack_48);
    this_00 = (TemplatedValidityMask<unsigned_long> *)
              SelectionVector::get_index((SelectionVector *)cidx,uStack_48);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (this_00,CONCAT17(in_stack_ffffffffffffff97,
                                        CONCAT16(in_stack_ffffffffffffff96,
                                                 CONCAT24(in_stack_ffffffffffffff94,
                                                          in_stack_ffffffffffffff90))));
    in_stack_ffffffffffffff96 = false;
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (this_00,CONCAT17(in_stack_ffffffffffffff97,
                                          (uint7)CONCAT24(in_stack_ffffffffffffff94,
                                                          in_stack_ffffffffffffff90)));
      in_stack_ffffffffffffff96 = false;
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (this_00,CONCAT17(in_stack_ffffffffffffff97,
                                            (uint7)CONCAT24(in_stack_ffffffffffffff94,
                                                            in_stack_ffffffffffffff90)));
        in_stack_ffffffffffffff96 = false;
        if (bVar1) {
          in_stack_ffffffffffffff96 =
               BothInclusiveBetweenOperator::Operation<int>
                         (CONCAT13(in_stack_ffffffffffffff97,(uint3)in_stack_ffffffffffffff94),
                          in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        }
      }
    }
    in_stack_ffffffffffffff97 = in_stack_ffffffffffffff96;
    SelectionVector::set_index
              (this,(idx_t)this_00,
               CONCAT17(in_stack_ffffffffffffff96,
                        CONCAT16(in_stack_ffffffffffffff96,
                                 CONCAT24(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))));
    uStack_38 = (in_stack_ffffffffffffff97 & 1) + uStack_38;
    SelectionVector::set_index
              (this,(idx_t)this_00,
               CONCAT17(in_stack_ffffffffffffff97,
                        CONCAT16(in_stack_ffffffffffffff96,
                                 CONCAT24(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))));
  }
  return uStack_38;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}